

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O2

string * __thiscall
antlr::MismatchedTokenException::tokenName_abi_cxx11_
          (string *__return_storage_ptr__,MismatchedTokenException *this,int tokenType)

{
  char *__s;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  if (tokenType == 0) {
    __s = "<Set of tokens>";
  }
  else {
    if ((tokenType < 0) || (this->numTokens <= tokenType)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"<",&local_59);
      operator+(&local_58,&local_38,tokenType);
      std::operator+(__return_storage_ptr__,&local_58,">");
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_38);
      return __return_storage_ptr__;
    }
    __s = this->tokenNames[(uint)tokenType];
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string MismatchedTokenException::tokenName(int tokenType) const
{
	if (tokenType == Token::INVALID_TYPE)
		return "<Set of tokens>";
	else if (tokenType < 0 || tokenType >= numTokens)
		return ANTLR_USE_NAMESPACE(std)string("<") + tokenType + ">";
	else
		return tokenNames[tokenType];
}